

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

nghttp2_stream_proto_state nghttp2_stream_get_state(nghttp2_stream *stream)

{
  byte bVar1;
  nghttp2_stream_proto_state nVar2;
  
  nVar2 = NGHTTP2_STREAM_STATE_CLOSED;
  if ((((stream->flags & 2) == 0) &&
      (((bVar1 = stream->shut_flags, (stream->flags & 1) == 0 ||
        ((nVar2 = NGHTTP2_STREAM_STATE_RESERVED_LOCAL, (bVar1 & 1) == 0 &&
         (nVar2 = NGHTTP2_STREAM_STATE_RESERVED_REMOTE, (bVar1 & 2) == 0)))) &&
       (nVar2 = NGHTTP2_STREAM_STATE_HALF_CLOSED_REMOTE, (bVar1 & 1) == 0)))) &&
     (nVar2 = NGHTTP2_STREAM_STATE_HALF_CLOSED_LOCAL, (bVar1 & 2) == 0)) {
    return (stream->state != NGHTTP2_STREAM_IDLE) + NGHTTP2_STREAM_STATE_IDLE;
  }
  return nVar2;
}

Assistant:

nghttp2_stream_proto_state nghttp2_stream_get_state(nghttp2_stream *stream) {
  if (stream->flags & NGHTTP2_STREAM_FLAG_CLOSED) {
    return NGHTTP2_STREAM_STATE_CLOSED;
  }

  if (stream->flags & NGHTTP2_STREAM_FLAG_PUSH) {
    if (stream->shut_flags & NGHTTP2_SHUT_RD) {
      return NGHTTP2_STREAM_STATE_RESERVED_LOCAL;
    }

    if (stream->shut_flags & NGHTTP2_SHUT_WR) {
      return NGHTTP2_STREAM_STATE_RESERVED_REMOTE;
    }
  }

  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    return NGHTTP2_STREAM_STATE_HALF_CLOSED_REMOTE;
  }

  if (stream->shut_flags & NGHTTP2_SHUT_WR) {
    return NGHTTP2_STREAM_STATE_HALF_CLOSED_LOCAL;
  }

  if (stream->state == NGHTTP2_STREAM_IDLE) {
    return NGHTTP2_STREAM_STATE_IDLE;
  }

  return NGHTTP2_STREAM_STATE_OPEN;
}